

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

bool __thiscall CConnman::AddNode(CConnman *this,AddedNodeParams *add)

{
  pointer pAVar1;
  size_t __n;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  byte bVar2;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  pointer addr;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock87;
  CService resolved;
  undefined1 in_stack_ffffffffffffff08 [15];
  undefined1 in_stack_ffffffffffffff17;
  byte bVar8;
  _Invoker_type in_stack_ffffffffffffff20;
  _Any_data local_d8;
  code *local_c8;
  _Any_data local_b8;
  code *local_a8;
  unique_lock<std::mutex> local_98;
  direct_or_indirect local_88;
  uint local_78;
  direct_or_indirect local_60;
  uint local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = GetDefaultPort(this,&add->m_added_node);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&local_b8,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._M_pod_data[0xf] = in_stack_ffffffffffffff17;
  dns_lookup_function.super__Function_base._M_functor._0_15_ = in_stack_ffffffffffffff08;
  dns_lookup_function.super__Function_base._M_manager = (_Manager_type)add;
  dns_lookup_function._M_invoker = in_stack_ffffffffffffff20;
  LookupNumeric((CService *)&local_60.indirect_contents,&add->m_added_node,uVar4,dns_lookup_function
               );
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  bVar2 = CNetAddr::IsValid((CNetAddr *)&local_60.indirect_contents);
  local_98._M_device = &(this->m_added_nodes_mutex).super_mutex;
  local_98._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_98);
  addr = (this->m_added_node_params).
         super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
         super__Vector_impl_data._M_start;
  pAVar1 = (this->m_added_node_params).
           super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar6 = addr == pAVar1;
  if (!bVar6) {
    bVar2 = bVar2 ^ 1;
    do {
      __n = (add->m_added_node)._M_string_length;
      bVar8 = bVar2;
      if (__n == (addr->m_added_node)._M_string_length) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar5 = bcmp((add->m_added_node)._M_dataplus._M_p,(addr->m_added_node)._M_dataplus._M_p,
                       __n);
          bVar7 = iVar5 == 0;
          bVar8 = bVar2;
        }
      }
      else {
        bVar7 = false;
      }
      bVar3 = bVar7;
      bVar2 = bVar8;
      if (bVar7 == false && bVar8 == 0) {
        uVar4 = GetDefaultPort(this,&addr->m_added_node);
        std::
        function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
        ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                    *)&local_d8,&g_dns_lookup_abi_cxx11_);
        dns_lookup_function_00.super__Function_base._M_functor._M_pod_data[0xf] = bVar2;
        dns_lookup_function_00.super__Function_base._M_functor._0_15_ = in_stack_ffffffffffffff08;
        dns_lookup_function_00.super__Function_base._M_manager = (_Manager_type)add;
        dns_lookup_function_00._M_invoker = (_Invoker_type)this;
        LookupNumeric((CService *)&local_88.indirect_contents,&addr->m_added_node,uVar4,
                      dns_lookup_function_00);
        bVar3 = ::operator==((CService *)&local_60.indirect_contents,
                             (CService *)&local_88.indirect_contents);
      }
      if (bVar7 == false && bVar8 == 0) {
        if (0x10 < local_78) {
          free(local_88.indirect_contents.indirect);
          local_88.indirect_contents.indirect = (char *)0x0;
        }
        if (local_c8 != (code *)0x0) {
          (*local_c8)(&local_d8,&local_d8,__destroy_functor);
        }
      }
      if (bVar3 != false) goto LAB_001af50b;
      addr = addr + 1;
      bVar6 = addr == pAVar1;
    } while (!bVar6);
  }
  std::vector<AddedNodeParams,_std::allocator<AddedNodeParams>_>::push_back
            (&this->m_added_node_params,add);
LAB_001af50b:
  std::unique_lock<std::mutex>::~unique_lock(&local_98);
  if (0x10 < local_50) {
    free(local_60.indirect_contents.indirect);
    local_60.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::AddNode(const AddedNodeParams& add)
{
    const CService resolved(LookupNumeric(add.m_added_node, GetDefaultPort(add.m_added_node)));
    const bool resolved_is_valid{resolved.IsValid()};

    LOCK(m_added_nodes_mutex);
    for (const auto& it : m_added_node_params) {
        if (add.m_added_node == it.m_added_node || (resolved_is_valid && resolved == LookupNumeric(it.m_added_node, GetDefaultPort(it.m_added_node)))) return false;
    }

    m_added_node_params.push_back(add);
    return true;
}